

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * __thiscall
absl::StrCat<std::__cxx11::string>
          (string *__return_storage_ptr__,absl *this,string_view first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest)

{
  size_t *psVar1;
  size_t *psVar2;
  string_view str;
  string local_50;
  string local_30;
  
  psVar1 = (size_t *)first._M_str;
  psVar2 = psVar1;
  StrCat_abi_cxx11_(&local_30,this,first);
  str._M_str = (char *)psVar2;
  str._M_len = *psVar1;
  StrCat_abi_cxx11_(&local_50,(absl *)psVar1[1],str);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StrCat(absl::string_view first, const T &...rest) {
  return StrCat(first) + StrCat(rest...);
}